

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O2

TYPE_ID __thiscall TypesHierarchy::GiveSubClass(TypesHierarchy *this,TYPE_ID oldone,TYPE_ID newone)

{
  TYPE_ID oldone_00;
  pointer pvVar1;
  TYPE_ID *pTVar2;
  ulong uVar3;
  TYPE_ID TVar4;
  TYPE_ID TVar5;
  TYPE_ID *pTVar6;
  
  pvVar1 = (this->types).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)oldone;
  TVar5 = newone;
  if ((ulong)(((long)(this->types).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) < uVar3) {
    pTVar6 = pvVar1[uVar3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar2 = *(pointer *)
              ((long)&pvVar1[uVar3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 8);
    do {
      if (pTVar6 == pTVar2) {
        return 0;
      }
      oldone_00 = *pTVar6;
      TVar5 = newone;
      if ((oldone_00 != newone) && (TVar4 = GiveSubClass(this,oldone_00,newone), TVar4 != oldone_00)
         ) {
        TVar5 = TVar4;
      }
      pTVar6 = pTVar6 + 1;
    } while (TVar5 == 0);
  }
  return TVar5;
}

Assistant:

TYPE_ID TypesHierarchy::GiveSubClass(TYPE_ID oldone, TYPE_ID newone) {
	vector<TYPE_ID>::iterator it;
	TYPE_ID t=0;

if (types.size() >= oldone) return newone; //hack

	for (it=types[oldone].begin(); it!=types[oldone].end(); it++) {
//		cerr << "====> new: " << newone << " ====> old: " << oldone << " ===> *it " << *it << endl;
			if (*it == newone) {
				t = newone;
			} else {
				t = GiveSubClass(*it, newone);
				if (t == *it) t = newone;
			}

			if (t) break;
	}
	return t;

}